

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie_test.cpp
# Opt level: O2

int trie_iterator_cb_clear(trie t,trie_key key,trie_value value,trie_cb_iterate_args args)

{
  if (value != (trie_value)0x0 && (key != (trie_key)0x0 && t != (trie)0x0)) {
    free(key);
    free(value);
    return 0;
  }
  return 1;
}

Assistant:

int trie_iterator_cb_clear(trie t, trie_key key, trie_value value, trie_cb_iterate_args args)
{
	(void)args;

	if (t != NULL && key != NULL && value != NULL)
	{
		free(key);

		free(value);

		return 0;
	}

	return 1;
}